

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SparseLU.h
# Opt level: O2

void __thiscall
Eigen::SparseLU<Eigen::SparseMatrix<double,_0,_int>,_Eigen::COLAMDOrdering<int>_>::factorize
          (SparseLU<Eigen::SparseMatrix<double,_0,_int>,_Eigen::COLAMDOrdering<int>_> *this,
          MatrixType *matrix)

{
  NCMatrix *this_00;
  string *psVar1;
  PermutationType *this_01;
  DenseIndex *this_02;
  Matrix<int,__1,_1,_0,__1,_1> *this_03;
  Matrix<int,__1,_1,_0,__1,_1> *this_04;
  Matrix<int,__1,_1,_0,__1,_1> *this_05;
  uint uVar2;
  Index IVar3;
  Index *pIVar4;
  int *piVar5;
  double *pdVar6;
  int *piVar7;
  DenseIndex DVar8;
  Index IVar9;
  GlobalLU_t *pGVar10;
  DenseBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_> *pDVar11;
  Index annz;
  int iVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  Scalar *pSVar16;
  RealScalar *diagpivotthresh;
  ulong uVar17;
  Scalar *pSVar18;
  Index i;
  long lVar19;
  SparseLU<Eigen::SparseMatrix<double,_0,_int>,_Eigen::COLAMDOrdering<int>_> *pSVar20;
  Index i_1;
  long lVar21;
  int jcol;
  ulong uVar22;
  long lVar23;
  DenseCoeffsBase<Eigen::Block<Eigen::Matrix<int,__1,_1,_0,__1,_1>,__1,_1,_false>,_1> local_478 [8];
  VectorBlock<Eigen::Matrix<int,__1,_1,_0,__1,_1>,__1> repfnz_k;
  ostringstream returnInfo;
  undefined1 local_2d8 [8];
  VectorBlock<Eigen::Matrix<int,__1,_1,_0,__1,_1>,__1> panel_lsubk;
  VectorBlock<Eigen::Matrix<int,__1,_1,_0,__1,_1>,__1> segrep_k;
  VectorBlock<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1> dense_k;
  BlockIndexVector local_248;
  BlockScalarVector local_230;
  BlockIndexVector local_218;
  BlockIndexVector local_200;
  BlockIndexVector local_1e8;
  BlockScalarVector local_1d0;
  BlockIndexVector local_1b8;
  string local_1a0 [32];
  undefined1 local_180 [8];
  IndexVector panel_histo;
  IndexVector segrep;
  PermutationType iperm_c;
  undefined1 auStack_128 [8];
  ScalarVector tempv;
  IndexVector parent;
  IndexVector xplore;
  IndexVector panel_lsub;
  IndexVector relax_end;
  undefined1 auStack_c8 [8];
  ScalarVector dense;
  undefined1 local_b0 [8];
  IndexVector repfnz;
  IndexVector xprune;
  Index pivrow;
  undefined1 local_80 [8];
  IndexVector marker;
  int local_5c;
  int local_58;
  Index nseg1;
  Index IStack_50;
  Index nseg;
  int local_44;
  DenseBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_> *local_40;
  SparseLU<Eigen::SparseMatrix<double,_0,_int>,_Eigen::COLAMDOrdering<int>_> *local_38;
  
  local_38 = this;
  if (this->m_analysisIsOk == false) {
    __assert_fail("m_analysisIsOk && \"analyzePattern() should be called first\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/UI233[P]Denoiser/./Eigen/src/SparseLU/SparseLU.h"
                  ,0x1c8,
                  "void Eigen::SparseLU<Eigen::SparseMatrix<double>>::factorize(const MatrixType &) [_MatrixType = Eigen::SparseMatrix<double>, _OrderingType = Eigen::COLAMDOrdering<int>]"
                 );
  }
  if (matrix->m_innerSize != matrix->m_outerSize) {
    __assert_fail("(matrix.rows() == matrix.cols()) && \"Only for squared matrices\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/UI233[P]Denoiser/./Eigen/src/SparseLU/SparseLU.h"
                  ,0x1c9,
                  "void Eigen::SparseLU<Eigen::SparseMatrix<double>>::factorize(const MatrixType &) [_MatrixType = Eigen::SparseMatrix<double>, _OrderingType = Eigen::COLAMDOrdering<int>]"
                 );
  }
  this_00 = &this->m_mat;
  SparseMatrix<double,_0,_int>::operator=(this_00,matrix);
  this_01 = &this->m_perm_c;
  if ((int)(this->m_perm_c).m_indices.super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.
           m_storage.m_rows == 0) {
    PermutationBase<Eigen::PermutationMatrix<-1,_-1,_int>_>::resize
              ((PermutationBase<Eigen::PermutationMatrix<_1,__1,_int>_> *)this_01,
               matrix->m_outerSize);
    for (lVar21 = 0; lVar21 < matrix->m_outerSize; lVar21 = lVar21 + 1) {
      pSVar16 = DenseCoeffsBase<Eigen::Matrix<int,_-1,_1,_0,_-1,_1>,_1>::operator()
                          ((DenseCoeffsBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>,_1> *)this_01,lVar21
                          );
      *pSVar16 = (Scalar)lVar21;
    }
  }
  else {
    SparseMatrix<double,_0,_int>::uncompress(this_00);
    marker.super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.m_storage.m_rows =
         (DenseIndex)matrix;
    if (matrix->m_innerNonZeros == (Index *)0x0) {
      local_40 = (DenseBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_> *)matrix->m_outerIndex;
    }
    else {
      lVar21 = (long)matrix->m_outerSize;
      uVar17 = 0xffffffffffffffff;
      if (-2 < lVar21) {
        uVar17 = lVar21 * 4 + 4;
      }
      local_40 = (DenseBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_> *)operator_new__(uVar17);
      pIVar4 = (local_38->m_mat).m_outerIndex;
      for (lVar19 = 0; lVar19 <= lVar21; lVar19 = lVar19 + 1) {
        *(Index *)((long)local_40 + lVar19 * 4) = pIVar4[lVar19];
      }
    }
    pDVar11 = local_40;
    lVar21 = 0;
    while (pSVar20 = local_38,
          lVar21 < *(int *)(marker.super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.
                            m_storage.m_rows + 4)) {
      _IStack_50 = (GlobalLU_t *)CONCAT44(nseg,*(Index *)((long)pDVar11 + lVar21 * 4));
      pIVar4 = (local_38->m_mat).m_outerIndex;
      pSVar16 = DenseCoeffsBase<Eigen::Matrix<int,_-1,_1,_0,_-1,_1>,_1>::operator()
                          ((DenseCoeffsBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>,_1> *)this_01,lVar21
                          );
      pIVar4[*pSVar16] = IStack_50;
      _IStack_50 = (GlobalLU_t *)(lVar21 + 1);
      iVar14 = *(int *)((long)pDVar11 + (lVar21 + 1) * 4);
      iVar13 = *(int *)((long)pDVar11 + lVar21 * 4);
      pIVar4 = (pSVar20->m_mat).m_innerNonZeros;
      pSVar16 = DenseCoeffsBase<Eigen::Matrix<int,_-1,_1,_0,_-1,_1>,_1>::operator()
                          ((DenseCoeffsBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>,_1> *)this_01,lVar21
                          );
      pIVar4[*pSVar16] = iVar14 - iVar13;
      lVar21 = (long)_IStack_50;
    }
    if ((local_40 != (DenseBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_> *)0x0) &&
       (*(long *)(marker.super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.m_storage.
                  m_rows + 0x18) != 0)) {
      operator_delete__(local_40);
    }
  }
  pSVar20 = local_38;
  iVar14 = (local_38->m_mat).m_outerSize;
  iVar13 = (local_38->m_mat).m_innerSize;
  annz = SparseMatrix<double,_0,_int>::nonZeros(this_00);
  uVar2 = (pSVar20->m_perfv).panel_size;
  iVar12 = internal::SparseLUImpl<double,_int>::memInit
                     ((SparseLUImpl<double,_int> *)pSVar20,iVar13,iVar14,annz,0,
                      (pSVar20->m_perfv).fillfactor,uVar2,&pSVar20->m_glu);
  if (iVar12 == 0) {
    lVar21 = (long)iVar13;
    this_02 = &panel_histo.super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.m_storage.
               m_rows;
    _IStack_50 = &pSVar20->m_glu;
    local_44 = iVar13;
    local_40 = (DenseBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_> *)(ulong)uVar2;
    Matrix<int,_-1,_1,_0,_-1,_1>::Matrix((Matrix<int,__1,_1,_0,__1,_1> *)this_02,lVar21);
    DenseBase<Eigen::Matrix<int,_-1,_1,_0,_-1,_1>_>::setZero
              ((DenseBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_> *)this_02);
    Matrix<int,_-1,_1,_0,_-1,_1>::Matrix
              ((Matrix<int,__1,_1,_0,__1,_1> *)
               &tempv.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                m_rows,lVar21);
    pDVar11 = local_40;
    DenseBase<Eigen::Matrix<int,_-1,_1,_0,_-1,_1>_>::setZero
              ((DenseBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_> *)
               &tempv.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                m_rows);
    Matrix<int,_-1,_1,_0,_-1,_1>::Matrix
              ((Matrix<int,__1,_1,_0,__1,_1> *)
               &parent.super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.m_storage.m_rows,
               lVar21);
    marker.super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.m_storage.m_rows = lVar21;
    local_58 = iVar14;
    DenseBase<Eigen::Matrix<int,_-1,_1,_0,_-1,_1>_>::setZero
              ((DenseBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_> *)
               &parent.super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.m_storage.m_rows)
    ;
    lVar21 = (long)((int)pDVar11 * local_44);
    Matrix<int,_-1,_1,_0,_-1,_1>::Matrix((Matrix<int,__1,_1,_0,__1,_1> *)local_b0,lVar21);
    Matrix<int,_-1,_1,_0,_-1,_1>::Matrix
              ((Matrix<int,__1,_1,_0,__1,_1> *)
               &xplore.super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.m_storage.m_rows,
               lVar21);
    lVar19 = (long)local_58;
    Matrix<int,_-1,_1,_0,_-1,_1>::Matrix
              ((Matrix<int,__1,_1,_0,__1,_1> *)
               &repfnz.super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.m_storage.m_rows,
               lVar19);
    DenseBase<Eigen::Matrix<int,_-1,_1,_0,_-1,_1>_>::setZero
              ((DenseBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_> *)
               &repfnz.super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.m_storage.m_rows)
    ;
    Matrix<int,_-1,_1,_0,_-1,_1>::Matrix
              ((Matrix<int,__1,_1,_0,__1,_1> *)local_80,
               marker.super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.m_storage.m_rows *
               3);
    DenseBase<Eigen::Matrix<int,_-1,_1,_0,_-1,_1>_>::setZero
              ((DenseBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_> *)local_80);
    repfnz_k.super_Block<Eigen::Matrix<int,__1,_1,_0,__1,_1>,__1,_1,_false>.
    super_BlockImpl<Eigen::Matrix<int,__1,_1,_0,__1,_1>,__1,_1,_false,_Eigen::Dense>.
    super_BlockImpl_dense<Eigen::Matrix<int,__1,_1,_0,__1,_1>,__1,_1,_false,_true>.m_outerStride =
         CONCAT44(repfnz_k.super_Block<Eigen::Matrix<int,__1,_1,_0,__1,_1>,__1,_1,_false>.
                  super_BlockImpl<Eigen::Matrix<int,__1,_1,_0,__1,_1>,__1,_1,_false,_Eigen::Dense>.
                  super_BlockImpl_dense<Eigen::Matrix<int,__1,_1,_0,__1,_1>,__1,_1,_false,_true>.
                  m_outerStride._4_4_,0xffffffff);
    DenseBase<Eigen::Matrix<int,_-1,_1,_0,_-1,_1>_>::setConstant
              ((DenseBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_> *)local_b0,
               (Scalar *)
               &repfnz_k.super_Block<Eigen::Matrix<int,__1,_1,_0,__1,_1>,__1,_1,_false>.
                super_BlockImpl<Eigen::Matrix<int,__1,_1,_0,__1,_1>,__1,_1,_false,_Eigen::Dense>.
                super_BlockImpl_dense<Eigen::Matrix<int,__1,_1,_0,__1,_1>,__1,_1,_false,_true>.
                m_outerStride);
    repfnz_k.super_Block<Eigen::Matrix<int,__1,_1,_0,__1,_1>,__1,_1,_false>.
    super_BlockImpl<Eigen::Matrix<int,__1,_1,_0,__1,_1>,__1,_1,_false,_Eigen::Dense>.
    super_BlockImpl_dense<Eigen::Matrix<int,__1,_1,_0,__1,_1>,__1,_1,_false,_true>.m_outerStride =
         CONCAT44(repfnz_k.super_Block<Eigen::Matrix<int,__1,_1,_0,__1,_1>,__1,_1,_false>.
                  super_BlockImpl<Eigen::Matrix<int,__1,_1,_0,__1,_1>,__1,_1,_false,_Eigen::Dense>.
                  super_BlockImpl_dense<Eigen::Matrix<int,__1,_1,_0,__1,_1>,__1,_1,_false,_true>.
                  m_outerStride._4_4_,0xffffffff);
    DenseBase<Eigen::Matrix<int,_-1,_1,_0,_-1,_1>_>::setConstant
              ((DenseBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_> *)
               &xplore.super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.m_storage.m_rows,
               (Scalar *)
               &repfnz_k.super_Block<Eigen::Matrix<int,__1,_1,_0,__1,_1>,__1,_1,_false>.
                super_BlockImpl<Eigen::Matrix<int,__1,_1,_0,__1,_1>,__1,_1,_false,_Eigen::Dense>.
                super_BlockImpl_dense<Eigen::Matrix<int,__1,_1,_0,__1,_1>,__1,_1,_false,_true>.
                m_outerStride);
    auStack_c8 = (undefined1  [8])0x0;
    dense.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
         (double *)0x0;
    PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::setZero
              ((PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)auStack_c8,lVar21);
    iVar14 = local_44;
    auStack_128 = (undefined1  [8])0x0;
    tempv.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
         (double *)0x0;
    iVar13 = ((local_38->m_perfv).maxsuper + local_44) * (local_38->m_perfv).panel_size;
    if (iVar13 < local_44) {
      iVar13 = local_44;
    }
    PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::setZero
              ((PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)auStack_128,(long)iVar13)
    ;
    pGVar10 = _IStack_50;
    iVar12 = local_58;
    repfnz_k.super_Block<Eigen::Matrix<int,__1,_1,_0,__1,_1>,__1,_1,_false>.
    super_BlockImpl<Eigen::Matrix<int,__1,_1,_0,__1,_1>,__1,_1,_false,_Eigen::Dense>.
    super_BlockImpl_dense<Eigen::Matrix<int,__1,_1,_0,__1,_1>,__1,_1,_false,_true>.m_outerStride =
         (Index)this_01;
    PermutationMatrix<-1,-1,int>::PermutationMatrix<Eigen::PermutationMatrix<_1,_1,int>>
              ((PermutationMatrix<_1,_1,int> *)
               &segrep.super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.m_storage.m_rows,
               (Transpose<Eigen::PermutationBase<Eigen::PermutationMatrix<_1,__1,_int>_>_> *)
               &repfnz_k.super_Block<Eigen::Matrix<int,__1,_1,_0,__1,_1>,__1,_1,_false>.
                super_BlockImpl<Eigen::Matrix<int,__1,_1,_0,__1,_1>,__1,_1,_false,_Eigen::Dense>.
                super_BlockImpl_dense<Eigen::Matrix<int,__1,_1,_0,__1,_1>,__1,_1,_false,_true>.
                m_outerStride);
    Matrix<int,_-1,_1,_0,_-1,_1>::Matrix
              ((Matrix<int,__1,_1,_0,__1,_1> *)
               &panel_lsub.super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.m_storage.
                m_rows,lVar19);
    iVar13 = (local_38->m_perfv).relax;
    if (local_38->m_symmetricmode == true) {
      internal::SparseLUImpl<double,_int>::heap_relax_snode
                ((SparseLUImpl<double,_int> *)local_38,iVar12,&local_38->m_etree,iVar13,
                 (IndexVector *)local_80,
                 (IndexVector *)
                 &panel_lsub.super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.m_storage.
                  m_rows);
    }
    else {
      internal::SparseLUImpl<double,_int>::relax_snode
                ((SparseLUImpl<double,_int> *)local_38,iVar12,&local_38->m_etree,iVar13,
                 (IndexVector *)local_80,
                 (IndexVector *)
                 &panel_lsub.super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.m_storage.
                  m_rows);
    }
    local_40 = (DenseBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_> *)&local_38->m_perm_r;
    PermutationBase<Eigen::PermutationMatrix<-1,_-1,_int>_>::resize
              ((PermutationBase<Eigen::PermutationMatrix<_1,__1,_int>_> *)local_40,iVar14);
    repfnz_k.super_Block<Eigen::Matrix<int,__1,_1,_0,__1,_1>,__1,_1,_false>.
    super_BlockImpl<Eigen::Matrix<int,__1,_1,_0,__1,_1>,__1,_1,_false,_Eigen::Dense>.
    super_BlockImpl_dense<Eigen::Matrix<int,__1,_1,_0,__1,_1>,__1,_1,_false,_true>.m_outerStride =
         CONCAT44(repfnz_k.super_Block<Eigen::Matrix<int,__1,_1,_0,__1,_1>,__1,_1,_false>.
                  super_BlockImpl<Eigen::Matrix<int,__1,_1,_0,__1,_1>,__1,_1,_false,_Eigen::Dense>.
                  super_BlockImpl_dense<Eigen::Matrix<int,__1,_1,_0,__1,_1>,__1,_1,_false,_true>.
                  m_outerStride._4_4_,0xffffffff);
    DenseBase<Eigen::Matrix<int,_-1,_1,_0,_-1,_1>_>::setConstant
              (local_40,(Scalar *)
                        &repfnz_k.super_Block<Eigen::Matrix<int,__1,_1,_0,__1,_1>,__1,_1,_false>.
                         super_BlockImpl<Eigen::Matrix<int,__1,_1,_0,__1,_1>,__1,_1,_false,_Eigen::Dense>
                         .
                         super_BlockImpl_dense<Eigen::Matrix<int,__1,_1,_0,__1,_1>,__1,_1,_false,_true>
                         .m_outerStride);
    repfnz_k.super_Block<Eigen::Matrix<int,__1,_1,_0,__1,_1>,__1,_1,_false>.
    super_BlockImpl<Eigen::Matrix<int,__1,_1,_0,__1,_1>,__1,_1,_false,_Eigen::Dense>.
    super_BlockImpl_dense<Eigen::Matrix<int,__1,_1,_0,__1,_1>,__1,_1,_false,_true>.m_outerStride =
         CONCAT44(repfnz_k.super_Block<Eigen::Matrix<int,__1,_1,_0,__1,_1>,__1,_1,_false>.
                  super_BlockImpl<Eigen::Matrix<int,__1,_1,_0,__1,_1>,__1,_1,_false,_Eigen::Dense>.
                  super_BlockImpl_dense<Eigen::Matrix<int,__1,_1,_0,__1,_1>,__1,_1,_false,_true>.
                  m_outerStride._4_4_,0xffffffff);
    DenseBase<Eigen::Matrix<int,_-1,_1,_0,_-1,_1>_>::setConstant
              ((DenseBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_> *)local_80,
               (Scalar *)
               &repfnz_k.super_Block<Eigen::Matrix<int,__1,_1,_0,__1,_1>,__1,_1,_false>.
                super_BlockImpl<Eigen::Matrix<int,__1,_1,_0,__1,_1>,__1,_1,_false,_Eigen::Dense>.
                super_BlockImpl_dense<Eigen::Matrix<int,__1,_1,_0,__1,_1>,__1,_1,_false,_true>.
                m_outerStride);
    local_38->m_detPermR = 1;
    this_03 = &(local_38->m_glu).supno;
    pSVar16 = DenseCoeffsBase<Eigen::Matrix<int,_-1,_1,_0,_-1,_1>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>,_1> *)this_03,0);
    *pSVar16 = -1;
    repfnz_k.super_Block<Eigen::Matrix<int,__1,_1,_0,__1,_1>,__1,_1,_false>.
    super_BlockImpl<Eigen::Matrix<int,__1,_1,_0,__1,_1>,__1,_1,_false,_Eigen::Dense>.
    super_BlockImpl_dense<Eigen::Matrix<int,__1,_1,_0,__1,_1>,__1,_1,_false,_true>.m_outerStride =
         repfnz_k.super_Block<Eigen::Matrix<int,__1,_1,_0,__1,_1>,__1,_1,_false>.
         super_BlockImpl<Eigen::Matrix<int,__1,_1,_0,__1,_1>,__1,_1,_false,_Eigen::Dense>.
         super_BlockImpl_dense<Eigen::Matrix<int,__1,_1,_0,__1,_1>,__1,_1,_false,_true>.
         m_outerStride & 0xffffffff00000000;
    DenseBase<Eigen::Matrix<int,_-1,_1,_0,_-1,_1>_>::setConstant
              ((DenseBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_> *)pGVar10,
               (Scalar *)
               &repfnz_k.super_Block<Eigen::Matrix<int,__1,_1,_0,__1,_1>,__1,_1,_false>.
                super_BlockImpl<Eigen::Matrix<int,__1,_1,_0,__1,_1>,__1,_1,_false,_Eigen::Dense>.
                super_BlockImpl_dense<Eigen::Matrix<int,__1,_1,_0,__1,_1>,__1,_1,_false,_true>.
                m_outerStride);
    this_04 = &(local_38->m_glu).xlusup;
    pSVar16 = DenseCoeffsBase<Eigen::Matrix<int,_-1,_1,_0,_-1,_1>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>,_1> *)this_04,0);
    *pSVar16 = 0;
    pSVar16 = DenseCoeffsBase<Eigen::Matrix<int,_-1,_1,_0,_-1,_1>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>,_1> *)
                         &(local_38->m_glu).xusub,0);
    *pSVar16 = 0;
    this_05 = &(local_38->m_glu).xlsub;
    pSVar16 = DenseCoeffsBase<Eigen::Matrix<int,_-1,_1,_0,_-1,_1>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>,_1> *)this_05,0);
    *pSVar16 = 0;
    pSVar16 = DenseCoeffsBase<Eigen::Matrix<int,_-1,_1,_0,_-1,_1>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>,_1> *)pGVar10,0);
    *pSVar16 = 0;
    Matrix<int,_-1,_1,_0,_-1,_1>::Matrix((Matrix<int,__1,_1,_0,__1,_1> *)local_180,lVar19);
    diagpivotthresh = &local_38->m_diagpivotthresh;
    iVar14 = 0;
    while (iVar13 = iVar14, pSVar20 = local_38, pGVar10 = _IStack_50, iVar14 = local_58,
          iVar13 < local_58) {
      uVar2 = (local_38->m_perfv).panel_size;
      uVar17 = (ulong)uVar2;
      iVar14 = uVar2 + iVar13;
      if (local_58 < iVar14) {
        iVar14 = local_58;
      }
      lVar21 = (long)iVar13;
      uVar22 = 0;
      do {
        lVar19 = lVar21 + 1 + uVar22;
        if (iVar14 <= lVar19) {
          iVar14 = iVar13 + (int)uVar22 + 1;
          goto LAB_0016b85b;
        }
        pSVar16 = DenseCoeffsBase<Eigen::Matrix<int,_-1,_1,_0,_-1,_1>,_1>::operator()
                            ((DenseCoeffsBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>,_1> *)
                             &panel_lsub.super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>
                              .m_storage.m_rows,lVar19);
        uVar22 = uVar22 + 1;
      } while (*pSVar16 == -1);
      iVar14 = iVar13 + (int)uVar22;
      uVar17 = uVar22;
LAB_0016b85b:
      pSVar20 = local_38;
      pGVar10 = _IStack_50;
      iVar12 = local_58 - iVar13;
      if (iVar14 != local_58) {
        iVar12 = (int)uVar17;
      }
      internal::SparseLUImpl<double,_int>::panel_dfs
                ((SparseLUImpl<double,_int> *)local_38,local_44,iVar12,iVar13,this_00,
                 (IndexVector *)local_40,&local_5c,(ScalarVector *)auStack_c8,
                 (IndexVector *)
                 &xplore.super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.m_storage.
                  m_rows,(IndexVector *)this_02,(IndexVector *)local_b0,
                 (IndexVector *)
                 &repfnz.super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.m_storage.
                  m_rows,(IndexVector *)local_80,
                 (IndexVector *)
                 &tempv.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                  m_rows,(IndexVector *)
                         &parent.super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.
                          m_storage.m_rows,_IStack_50);
      internal::SparseLUImpl<double,_int>::panel_bmod
                ((SparseLUImpl<double,_int> *)pSVar20,local_44,iVar12,iVar13,local_5c,
                 (ScalarVector *)auStack_c8,(ScalarVector *)auStack_128,
                 (IndexVector *)
                 &panel_histo.super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.m_storage.
                  m_rows,(IndexVector *)local_b0,pGVar10);
      for (lVar19 = lVar21;
          DVar8 = marker.super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.m_storage.
                  m_rows, iVar14 = iVar12 + iVar13, lVar19 < iVar12 + iVar13; lVar19 = lVar19 + 1) {
        lVar23 = (lVar19 - lVar21) *
                 marker.super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.m_storage.m_rows
        ;
        nseg1 = local_5c;
        VectorBlock<Eigen::Matrix<int,_-1,_1,_0,_-1,_1>,_-1>::VectorBlock
                  ((VectorBlock<Eigen::Matrix<int,__1,_1,_0,__1,_1>,__1> *)local_2d8,
                   (Matrix<int,__1,_1,_0,__1,_1> *)
                   &xplore.super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.m_storage.
                    m_rows,lVar23,
                   marker.super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.m_storage.
                   m_rows);
        VectorBlock<Eigen::Matrix<int,_-1,_1,_0,_-1,_1>,_-1>::VectorBlock
                  ((VectorBlock<Eigen::Matrix<int,__1,_1,_0,__1,_1>,__1> *)local_478,
                   (Matrix<int,__1,_1,_0,__1,_1> *)local_b0,lVar23,DVar8);
        iVar14 = (local_38->m_perfv).maxsuper;
        Ref<Eigen::Matrix<int,-1,1,0,-1,1>,0,Eigen::InnerStride<1>>::
        Ref<Eigen::Block<Eigen::Matrix<int,_1,1,0,_1,1>,_1,1,false>>
                  ((Ref<Eigen::Matrix<int,_1,1,0,_1,1>,0,Eigen::InnerStride<1>> *)
                   &dense_k.super_Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>.
                    super_BlockImpl<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false,_Eigen::Dense>
                    .
                    super_BlockImpl_dense<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false,_true>
                    .m_outerStride,
                   (DenseBase<Eigen::Block<Eigen::Matrix<int,__1,_1,_0,__1,_1>,__1,_1,_false>_> *)
                   local_2d8);
        Ref<Eigen::Matrix<int,-1,1,0,-1,1>,0,Eigen::InnerStride<1>>::
        Ref<Eigen::Block<Eigen::Matrix<int,_1,1,0,_1,1>,_1,1,false>>
                  ((Ref<Eigen::Matrix<int,_1,1,0,_1,1>,0,Eigen::InnerStride<1>> *)&local_248,
                   (DenseBase<Eigen::Block<Eigen::Matrix<int,__1,_1,_0,__1,_1>,__1,_1,_false>_> *)
                   local_478);
        jcol = (int)lVar19;
        iVar14 = internal::SparseLUImpl<double,_int>::column_dfs
                           ((SparseLUImpl<double,_int> *)local_38,local_44,jcol,
                            (IndexVector *)local_40,iVar14,&nseg1,
                            (BlockIndexVector *)
                            &dense_k.
                             super_Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>.
                             super_BlockImpl<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false,_Eigen::Dense>
                             .
                             super_BlockImpl_dense<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false,_true>
                             .m_outerStride,(IndexVector *)this_02,&local_248,
                            (IndexVector *)
                            &repfnz.super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.
                             m_storage.m_rows,(IndexVector *)local_80,
                            (IndexVector *)
                            &tempv.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                             m_storage.m_rows,
                            (IndexVector *)
                            &parent.super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.
                             m_storage.m_rows,_IStack_50);
        pSVar20 = local_38;
        DVar8 = marker.super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.m_storage.m_rows;
        if (iVar14 != 0) {
          std::__cxx11::string::assign((char *)&local_38->m_lastError);
LAB_0016bc15:
          pSVar20->m_info = NumericalIssue;
          pSVar20->m_factorizationIsOk = false;
          goto LAB_0016bc9b;
        }
        VectorBlock<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_-1>::VectorBlock
                  ((VectorBlock<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1> *)
                   &segrep_k.super_Block<Eigen::Matrix<int,__1,_1,_0,__1,_1>,__1,_1,_false>.
                    super_BlockImpl<Eigen::Matrix<int,__1,_1,_0,__1,_1>,__1,_1,_false,_Eigen::Dense>
                    .super_BlockImpl_dense<Eigen::Matrix<int,__1,_1,_0,__1,_1>,__1,_1,_false,_true>.
                    m_outerStride,(Matrix<double,__1,_1,_0,__1,_1> *)auStack_c8,lVar23,
                   marker.super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.m_storage.
                   m_rows);
        VectorBlock<Eigen::Matrix<int,_-1,_1,_0,_-1,_1>,_-1>::VectorBlock
                  ((VectorBlock<Eigen::Matrix<int,__1,_1,_0,__1,_1>,__1> *)
                   &panel_lsubk.super_Block<Eigen::Matrix<int,__1,_1,_0,__1,_1>,__1,_1,_false>.
                    super_BlockImpl<Eigen::Matrix<int,__1,_1,_0,__1,_1>,__1,_1,_false,_Eigen::Dense>
                    .super_BlockImpl_dense<Eigen::Matrix<int,__1,_1,_0,__1,_1>,__1,_1,_false,_true>.
                    m_outerStride,(Matrix<int,__1,_1,_0,__1,_1> *)this_02,(long)local_5c,
                   DVar8 - local_5c);
        iVar14 = nseg1 - local_5c;
        Ref<Eigen::Matrix<double,-1,1,0,-1,1>,0,Eigen::InnerStride<1>>::
        Ref<Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>,_1,1,false>>
                  ((Ref<Eigen::Matrix<double,_1,1,0,_1,1>,0,Eigen::InnerStride<1>> *)&local_230,
                   (DenseBase<Eigen::Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>_> *
                   )&segrep_k.super_Block<Eigen::Matrix<int,__1,_1,_0,__1,_1>,__1,_1,_false>.
                     super_BlockImpl<Eigen::Matrix<int,__1,_1,_0,__1,_1>,__1,_1,_false,_Eigen::Dense>
                     .super_BlockImpl_dense<Eigen::Matrix<int,__1,_1,_0,__1,_1>,__1,_1,_false,_true>
                     .m_outerStride);
        Ref<Eigen::Matrix<int,-1,1,0,-1,1>,0,Eigen::InnerStride<1>>::
        Ref<Eigen::Block<Eigen::Matrix<int,_1,1,0,_1,1>,_1,1,false>>
                  ((Ref<Eigen::Matrix<int,_1,1,0,_1,1>,0,Eigen::InnerStride<1>> *)&local_218,
                   (DenseBase<Eigen::Block<Eigen::Matrix<int,__1,_1,_0,__1,_1>,__1,_1,_false>_> *)
                   &panel_lsubk.super_Block<Eigen::Matrix<int,__1,_1,_0,__1,_1>,__1,_1,_false>.
                    super_BlockImpl<Eigen::Matrix<int,__1,_1,_0,__1,_1>,__1,_1,_false,_Eigen::Dense>
                    .super_BlockImpl_dense<Eigen::Matrix<int,__1,_1,_0,__1,_1>,__1,_1,_false,_true>.
                    m_outerStride);
        Ref<Eigen::Matrix<int,-1,1,0,-1,1>,0,Eigen::InnerStride<1>>::
        Ref<Eigen::Block<Eigen::Matrix<int,_1,1,0,_1,1>,_1,1,false>>
                  ((Ref<Eigen::Matrix<int,_1,1,0,_1,1>,0,Eigen::InnerStride<1>> *)&local_200,
                   (DenseBase<Eigen::Block<Eigen::Matrix<int,__1,_1,_0,__1,_1>,__1,_1,_false>_> *)
                   local_478);
        iVar14 = internal::SparseLUImpl<double,_int>::column_bmod
                           ((SparseLUImpl<double,_int> *)local_38,jcol,iVar14,&local_230,
                            (ScalarVector *)auStack_128,&local_218,&local_200,iVar13,_IStack_50);
        pSVar20 = local_38;
        IVar9 = nseg1;
        if (iVar14 != 0) {
          std::__cxx11::string::assign((char *)&local_38->m_lastError);
          goto LAB_0016bc15;
        }
        Ref<Eigen::Matrix<int,-1,1,0,-1,1>,0,Eigen::InnerStride<1>>::
        Ref<Eigen::Block<Eigen::Matrix<int,_1,1,0,_1,1>,_1,1,false>>
                  ((Ref<Eigen::Matrix<int,_1,1,0,_1,1>,0,Eigen::InnerStride<1>> *)&local_1e8,
                   (DenseBase<Eigen::Block<Eigen::Matrix<int,__1,_1,_0,__1,_1>,__1,_1,_false>_> *)
                   local_478);
        Ref<Eigen::Matrix<double,-1,1,0,-1,1>,0,Eigen::InnerStride<1>>::
        Ref<Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>,_1,1,false>>
                  ((Ref<Eigen::Matrix<double,_1,1,0,_1,1>,0,Eigen::InnerStride<1>> *)&local_1d0,
                   (DenseBase<Eigen::Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>_> *
                   )&segrep_k.super_Block<Eigen::Matrix<int,__1,_1,_0,__1,_1>,__1,_1,_false>.
                     super_BlockImpl<Eigen::Matrix<int,__1,_1,_0,__1,_1>,__1,_1,_false,_Eigen::Dense>
                     .super_BlockImpl_dense<Eigen::Matrix<int,__1,_1,_0,__1,_1>,__1,_1,_false,_true>
                     .m_outerStride);
        iVar14 = internal::SparseLUImpl<double,_int>::copy_to_ucol
                           ((SparseLUImpl<double,_int> *)local_38,jcol,IVar9,(IndexVector *)this_02,
                            &local_1e8,(IndexVector *)local_40,&local_1d0,_IStack_50);
        pSVar20 = local_38;
        if (iVar14 != 0) {
          std::__cxx11::string::assign((char *)&local_38->m_lastError);
          goto LAB_0016bc15;
        }
        iVar15 = internal::SparseLUImpl<double,_int>::pivotL
                           ((SparseLUImpl<double,_int> *)local_38,jcol,diagpivotthresh,
                            (IndexVector *)local_40,
                            (IndexVector *)
                            &segrep.super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.
                             m_storage.m_rows,
                            (int *)((long)&xprune.
                                           super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>
                                           .m_storage.m_rows + 4),_IStack_50);
        IVar9 = nseg1;
        iVar14 = xprune.super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.m_storage.m_rows
                 ._4_4_;
        if (iVar15 != 0) {
          psVar1 = &local_38->m_lastError;
          std::__cxx11::string::assign((char *)psVar1);
          std::__cxx11::ostringstream::ostringstream
                    ((ostringstream *)
                     &repfnz_k.super_Block<Eigen::Matrix<int,__1,_1,_0,__1,_1>,__1,_1,_false>.
                      super_BlockImpl<Eigen::Matrix<int,__1,_1,_0,__1,_1>,__1,_1,_false,_Eigen::Dense>
                      .
                      super_BlockImpl_dense<Eigen::Matrix<int,__1,_1,_0,__1,_1>,__1,_1,_false,_true>
                      .m_outerStride);
          std::ostream::operator<<
                    (&repfnz_k.super_Block<Eigen::Matrix<int,__1,_1,_0,__1,_1>,__1,_1,_false>.
                      super_BlockImpl<Eigen::Matrix<int,__1,_1,_0,__1,_1>,__1,_1,_false,_Eigen::Dense>
                      .
                      super_BlockImpl_dense<Eigen::Matrix<int,__1,_1,_0,__1,_1>,__1,_1,_false,_true>
                      .m_outerStride,iVar15);
          std::__cxx11::stringbuf::str();
          std::__cxx11::string::append((string *)psVar1);
          std::__cxx11::string::~string(local_1a0);
          local_38->m_info = NumericalIssue;
          local_38->m_factorizationIsOk = false;
          std::__cxx11::ostringstream::~ostringstream
                    ((ostringstream *)
                     &repfnz_k.super_Block<Eigen::Matrix<int,__1,_1,_0,__1,_1>,__1,_1,_false>.
                      super_BlockImpl<Eigen::Matrix<int,__1,_1,_0,__1,_1>,__1,_1,_false,_Eigen::Dense>
                      .
                      super_BlockImpl_dense<Eigen::Matrix<int,__1,_1,_0,__1,_1>,__1,_1,_false,_true>
                      .m_outerStride);
          goto LAB_0016bc9b;
        }
        if (xprune.super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.m_storage.m_rows.
            _4_4_ != jcol) {
          local_38->m_detPermR = -local_38->m_detPermR;
        }
        Ref<Eigen::Matrix<int,-1,1,0,-1,1>,0,Eigen::InnerStride<1>>::
        Ref<Eigen::Block<Eigen::Matrix<int,_1,1,0,_1,1>,_1,1,false>>
                  ((Ref<Eigen::Matrix<int,_1,1,0,_1,1>,0,Eigen::InnerStride<1>> *)&local_1b8,
                   (DenseBase<Eigen::Block<Eigen::Matrix<int,__1,_1,_0,__1,_1>,__1,_1,_false>_> *)
                   local_478);
        internal::SparseLUImpl<double,_int>::pruneL
                  ((SparseLUImpl<double,_int> *)local_38,jcol,(IndexVector *)local_40,iVar14,IVar9,
                   (IndexVector *)this_02,&local_1b8,
                   (IndexVector *)
                   &repfnz.super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.m_storage.
                    m_rows,_IStack_50);
        for (lVar23 = 0; lVar23 < nseg1; lVar23 = lVar23 + 1) {
          pSVar16 = DenseCoeffsBase<Eigen::Matrix<int,_-1,_1,_0,_-1,_1>,_1>::operator()
                              ((DenseCoeffsBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>,_1> *)this_02,
                               lVar23);
          pSVar18 = DenseCoeffsBase<Eigen::Block<Eigen::Matrix<int,_-1,_1,_0,_-1,_1>,_-1,_1,_false>,_1>
                    ::operator()(local_478,(long)*pSVar16);
          *pSVar18 = -1;
        }
      }
    }
    internal::SparseLUImpl<double,_int>::countnz
              ((SparseLUImpl<double,_int> *)local_38,local_58,&local_38->m_nnzL,&local_38->m_nnzU,
               _IStack_50);
    iVar13 = local_44;
    internal::SparseLUImpl<double,_int>::fixupL
              ((SparseLUImpl<double,_int> *)pSVar20,iVar14,(IndexVector *)local_40,pGVar10);
    internal::MappedSuperNodalMatrix<double,_int>::setInfos
              (&pSVar20->m_Lstore,iVar13,iVar14,&(pSVar20->m_glu).lusup,this_04,
               &(pSVar20->m_glu).lsub,this_05,this_03,&pGVar10->xsup);
    IVar3 = pSVar20->m_nnzU;
    piVar5 = (pSVar20->m_glu).xusub.super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.
             m_storage.m_data;
    pdVar6 = (pSVar20->m_glu).ucol.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
             m_storage.m_data;
    piVar7 = (pSVar20->m_glu).usub.super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.
             m_storage.m_data;
    (pSVar20->m_Ustore).super_SparseMatrixBase<Eigen::MappedSparseMatrix<double,_0,_int>_>.
    m_isRValue = false;
    (pSVar20->m_Ustore).m_outerSize = iVar14;
    (pSVar20->m_Ustore).m_innerSize = iVar13;
    (pSVar20->m_Ustore).m_nnz = IVar3;
    (pSVar20->m_Ustore).m_outerIndex = piVar5;
    (pSVar20->m_Ustore).m_innerIndices = piVar7;
    (pSVar20->m_Ustore).m_values = pdVar6;
    pSVar20->m_info = Success;
    pSVar20->m_factorizationIsOk = true;
LAB_0016bc9b:
    free((void *)local_180);
    free((void *)panel_lsub.super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.m_storage.
                 m_rows);
    free((void *)segrep.super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.m_storage.m_rows
        );
    free((void *)auStack_128);
    free((void *)auStack_c8);
    free((void *)local_80);
    free((void *)repfnz.super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.m_storage.m_rows
        );
    free((void *)xplore.super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.m_storage.m_rows
        );
    free((void *)local_b0);
    free((void *)parent.super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.m_storage.m_rows
        );
    free((void *)tempv.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                 m_rows);
    free((void *)panel_histo.super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.m_storage.
                 m_rows);
  }
  else {
    std::__cxx11::string::assign((char *)&pSVar20->m_lastError);
    pSVar20->m_factorizationIsOk = false;
  }
  return;
}

Assistant:

void SparseLU<MatrixType, OrderingType>::factorize(const MatrixType& matrix)
{
  using internal::emptyIdxLU;
  eigen_assert(m_analysisIsOk && "analyzePattern() should be called first"); 
  eigen_assert((matrix.rows() == matrix.cols()) && "Only for squared matrices");
  
  typedef typename IndexVector::Scalar Index; 
  
  
  // Apply the column permutation computed in analyzepattern()
  //   m_mat = matrix * m_perm_c.inverse(); 
  m_mat = matrix;
  if (m_perm_c.size()) 
  {
    m_mat.uncompress(); //NOTE: The effect of this command is only to create the InnerNonzeros pointers.
    //Then, permute only the column pointers
    const Index * outerIndexPtr;
    if (matrix.isCompressed()) outerIndexPtr = matrix.outerIndexPtr();
    else
    {
      Index* outerIndexPtr_t = new Index[matrix.cols()+1];
      for(Index i = 0; i <= matrix.cols(); i++) outerIndexPtr_t[i] = m_mat.outerIndexPtr()[i];
      outerIndexPtr = outerIndexPtr_t;
    }
    for (Index i = 0; i < matrix.cols(); i++)
    {
      m_mat.outerIndexPtr()[m_perm_c.indices()(i)] = outerIndexPtr[i];
      m_mat.innerNonZeroPtr()[m_perm_c.indices()(i)] = outerIndexPtr[i+1] - outerIndexPtr[i];
    }
    if(!matrix.isCompressed()) delete[] outerIndexPtr;
  } 
  else 
  { //FIXME This should not be needed if the empty permutation is handled transparently
    m_perm_c.resize(matrix.cols());
    for(Index i = 0; i < matrix.cols(); ++i) m_perm_c.indices()(i) = i;
  }
  
  Index m = m_mat.rows();
  Index n = m_mat.cols();
  Index nnz = m_mat.nonZeros();
  Index maxpanel = m_perfv.panel_size * m;
  // Allocate working storage common to the factor routines
  Index lwork = 0;
  Index info = Base::memInit(m, n, nnz, lwork, m_perfv.fillfactor, m_perfv.panel_size, m_glu); 
  if (info) 
  {
    m_lastError = "UNABLE TO ALLOCATE WORKING MEMORY\n\n" ;
    m_factorizationIsOk = false;
    return ; 
  }
  
  // Set up pointers for integer working arrays 
  IndexVector segrep(m); segrep.setZero();
  IndexVector parent(m); parent.setZero();
  IndexVector xplore(m); xplore.setZero();
  IndexVector repfnz(maxpanel);
  IndexVector panel_lsub(maxpanel);
  IndexVector xprune(n); xprune.setZero();
  IndexVector marker(m*internal::LUNoMarker); marker.setZero();
  
  repfnz.setConstant(-1); 
  panel_lsub.setConstant(-1);
  
  // Set up pointers for scalar working arrays 
  ScalarVector dense; 
  dense.setZero(maxpanel);
  ScalarVector tempv; 
  tempv.setZero(internal::LUnumTempV(m, m_perfv.panel_size, m_perfv.maxsuper, /*m_perfv.rowblk*/m) );
  
  // Compute the inverse of perm_c
  PermutationType iperm_c(m_perm_c.inverse()); 
  
  // Identify initial relaxed snodes
  IndexVector relax_end(n);
  if ( m_symmetricmode == true ) 
    Base::heap_relax_snode(n, m_etree, m_perfv.relax, marker, relax_end);
  else
    Base::relax_snode(n, m_etree, m_perfv.relax, marker, relax_end);
  
  
  m_perm_r.resize(m); 
  m_perm_r.indices().setConstant(-1);
  marker.setConstant(-1);
  m_detPermR = 1; // Record the determinant of the row permutation
  
  m_glu.supno(0) = emptyIdxLU; m_glu.xsup.setConstant(0);
  m_glu.xsup(0) = m_glu.xlsub(0) = m_glu.xusub(0) = m_glu.xlusup(0) = Index(0);
  
  // Work on one 'panel' at a time. A panel is one of the following :
  //  (a) a relaxed supernode at the bottom of the etree, or
  //  (b) panel_size contiguous columns, <panel_size> defined by the user
  Index jcol; 
  IndexVector panel_histo(n);
  Index pivrow; // Pivotal row number in the original row matrix
  Index nseg1; // Number of segments in U-column above panel row jcol
  Index nseg; // Number of segments in each U-column 
  Index irep; 
  Index i, k, jj; 
  for (jcol = 0; jcol < n; )
  {
    // Adjust panel size so that a panel won't overlap with the next relaxed snode. 
    Index panel_size = m_perfv.panel_size; // upper bound on panel width
    for (k = jcol + 1; k < (std::min)(jcol+panel_size, n); k++)
    {
      if (relax_end(k) != emptyIdxLU) 
      {
        panel_size = k - jcol; 
        break; 
      }
    }
    if (k == n) 
      panel_size = n - jcol; 
      
    // Symbolic outer factorization on a panel of columns 
    Base::panel_dfs(m, panel_size, jcol, m_mat, m_perm_r.indices(), nseg1, dense, panel_lsub, segrep, repfnz, xprune, marker, parent, xplore, m_glu); 
    
    // Numeric sup-panel updates in topological order 
    Base::panel_bmod(m, panel_size, jcol, nseg1, dense, tempv, segrep, repfnz, m_glu); 
    
    // Sparse LU within the panel, and below the panel diagonal 
    for ( jj = jcol; jj< jcol + panel_size; jj++) 
    {
      k = (jj - jcol) * m; // Column index for w-wide arrays 
      
      nseg = nseg1; // begin after all the panel segments
      //Depth-first-search for the current column
      VectorBlock<IndexVector> panel_lsubk(panel_lsub, k, m);
      VectorBlock<IndexVector> repfnz_k(repfnz, k, m); 
      info = Base::column_dfs(m, jj, m_perm_r.indices(), m_perfv.maxsuper, nseg, panel_lsubk, segrep, repfnz_k, xprune, marker, parent, xplore, m_glu); 
      if ( info ) 
      {
        m_lastError =  "UNABLE TO EXPAND MEMORY IN COLUMN_DFS() ";
        m_info = NumericalIssue; 
        m_factorizationIsOk = false; 
        return; 
      }
      // Numeric updates to this column 
      VectorBlock<ScalarVector> dense_k(dense, k, m); 
      VectorBlock<IndexVector> segrep_k(segrep, nseg1, m-nseg1); 
      info = Base::column_bmod(jj, (nseg - nseg1), dense_k, tempv, segrep_k, repfnz_k, jcol, m_glu); 
      if ( info ) 
      {
        m_lastError = "UNABLE TO EXPAND MEMORY IN COLUMN_BMOD() ";
        m_info = NumericalIssue; 
        m_factorizationIsOk = false; 
        return; 
      }
      
      // Copy the U-segments to ucol(*)
      info = Base::copy_to_ucol(jj, nseg, segrep, repfnz_k ,m_perm_r.indices(), dense_k, m_glu); 
      if ( info ) 
      {
        m_lastError = "UNABLE TO EXPAND MEMORY IN COPY_TO_UCOL() ";
        m_info = NumericalIssue; 
        m_factorizationIsOk = false; 
        return; 
      }
      
      // Form the L-segment 
      info = Base::pivotL(jj, m_diagpivotthresh, m_perm_r.indices(), iperm_c.indices(), pivrow, m_glu);
      if ( info ) 
      {
        m_lastError = "THE MATRIX IS STRUCTURALLY SINGULAR ... ZERO COLUMN AT ";
        std::ostringstream returnInfo;
        returnInfo << info; 
        m_lastError += returnInfo.str();
        m_info = NumericalIssue; 
        m_factorizationIsOk = false; 
        return; 
      }
      
      // Update the determinant of the row permutation matrix
      if (pivrow != jj) m_detPermR *= -1;

      // Prune columns (0:jj-1) using column jj
      Base::pruneL(jj, m_perm_r.indices(), pivrow, nseg, segrep, repfnz_k, xprune, m_glu); 
      
      // Reset repfnz for this column 
      for (i = 0; i < nseg; i++)
      {
        irep = segrep(i); 
        repfnz_k(irep) = emptyIdxLU; 
      }
    } // end SparseLU within the panel  
    jcol += panel_size;  // Move to the next panel
  } // end for -- end elimination 
  
  // Count the number of nonzeros in factors 
  Base::countnz(n, m_nnzL, m_nnzU, m_glu); 
  // Apply permutation  to the L subscripts 
  Base::fixupL(n, m_perm_r.indices(), m_glu); 
  
  // Create supernode matrix L 
  m_Lstore.setInfos(m, n, m_glu.lusup, m_glu.xlusup, m_glu.lsub, m_glu.xlsub, m_glu.supno, m_glu.xsup); 
  // Create the column major upper sparse matrix  U; 
  new (&m_Ustore) MappedSparseMatrix<Scalar, ColMajor, Index> ( m, n, m_nnzU, m_glu.xusub.data(), m_glu.usub.data(), m_glu.ucol.data() ); 
  
  m_info = Success;
  m_factorizationIsOk = true;
}